

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::b_formatter<spdlog::details::scoped_padder>::format
          (b_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  char *__s;
  size_t wrapped_size;
  char *buf_ptr;
  scoped_padder p;
  scoped_padder sStack_48;
  
  __s = *(char **)(months + (long)tm_time->tm_mon * 8);
  wrapped_size = strlen(__s);
  scoped_padder::scoped_padder(&sStack_48,wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  ::fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + wrapped_size);
  scoped_padder::~scoped_padder(&sStack_48);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        string_view_t field_value{months[static_cast<size_t>(tm_time.tm_mon)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }